

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor.cpp
# Opt level: O0

void celero::executor::RunExperiments(shared_ptr<celero::Benchmark> *bmark)

{
  bool bVar1;
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  shared_ptr<celero::Experiment> local_40;
  undefined1 local_30 [8];
  shared_ptr<celero::Experiment> e;
  size_t i;
  size_t experimentSize;
  shared_ptr<celero::Benchmark> *bmark_local;
  
  bVar1 = std::operator==(bmark,(nullptr_t)0x0);
  if (!bVar1) {
    peVar2 = std::__shared_ptr_access<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)bmark);
    p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)Benchmark::getExperimentSize(peVar2);
    for (e.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        e.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi <
        p_Var3; e.super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                        ((long)&(e.
                                 super___shared_ptr<celero::Experiment,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount._M_pi)->_vptr__Sp_counted_base + 1)) {
      peVar2 = std::__shared_ptr_access<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<celero::Benchmark,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)bmark);
      Benchmark::getExperiment((Benchmark *)local_30,(size_t)peVar2);
      bVar1 = std::operator!=((shared_ptr<celero::Experiment> *)local_30,(nullptr_t)0x0);
      if (!bVar1) {
        __assert_fail("e != nullptr",
                      "/workspace/llm4binary/github/license_c_cmakelists/DigitalInBlue[P]Celero/src/Executor.cpp"
                      ,0x119,"void celero::executor::RunExperiments(std::shared_ptr<Benchmark>)");
      }
      std::shared_ptr<celero::Experiment>::shared_ptr
                (&local_40,(shared_ptr<celero::Experiment> *)local_30);
      Run(&local_40);
      std::shared_ptr<celero::Experiment>::~shared_ptr(&local_40);
      std::shared_ptr<celero::Experiment>::~shared_ptr((shared_ptr<celero::Experiment> *)local_30);
    }
  }
  return;
}

Assistant:

void executor::RunExperiments(std::shared_ptr<Benchmark> bmark)
{
	if(bmark == nullptr)
	{
		return;
	}

	const auto experimentSize = bmark->getExperimentSize();

	for(size_t i = 0; i < experimentSize; i++)
	{
		auto e = bmark->getExperiment(i);
		assert(e != nullptr);

		executor::Run(e);
	}
}